

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void notValidImpl(Parse *pParse,NameContext *pNC,char *zMsg,Expr *pExpr,Expr *pError)

{
  uint uVar1;
  char *pcVar2;
  
  uVar1 = pNC->ncFlags;
  if ((uVar1 & 0x20) == 0) {
    if ((uVar1 & 4) == 0) {
      pcVar2 = "generated columns";
      if ((uVar1 & 8) == 0) {
        pcVar2 = "partial index WHERE clauses";
      }
    }
    else {
      pcVar2 = "CHECK constraints";
    }
  }
  else {
    pcVar2 = "index expressions";
  }
  sqlite3ErrorMsg(pParse,"%s prohibited in %s",zMsg,pcVar2);
  if (pExpr != (Expr *)0x0) {
    pExpr->op = 'z';
  }
  sqlite3RecordErrorOffsetOfExpr(pParse->db,pError);
  return;
}

Assistant:

static void notValidImpl(
   Parse *pParse,       /* Leave error message here */
   NameContext *pNC,    /* The name context */
   const char *zMsg,    /* Type of error */
   Expr *pExpr,         /* Invalidate this expression on error */
   Expr *pError         /* Associate error with this expression */
){
  const char *zIn = "partial index WHERE clauses";
  if( pNC->ncFlags & NC_IdxExpr )      zIn = "index expressions";
#ifndef SQLITE_OMIT_CHECK
  else if( pNC->ncFlags & NC_IsCheck ) zIn = "CHECK constraints";
#endif
#ifndef SQLITE_OMIT_GENERATED_COLUMNS
  else if( pNC->ncFlags & NC_GenCol ) zIn = "generated columns";
#endif
  sqlite3ErrorMsg(pParse, "%s prohibited in %s", zMsg, zIn);
  if( pExpr ) pExpr->op = TK_NULL;
  sqlite3RecordErrorOffsetOfExpr(pParse->db, pError);
}